

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_boundary.cpp
# Opt level: O1

void __thiscall duckdb::CSVBoundary::Print(CSVBoundary *this)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"---Boundary: ",0xd);
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)&::std::cout);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," ---",4);
  uStack_28._0_4_ = CONCAT13(10,(undefined3)uStack_28);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 3),1);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"Buffer Index: ",0xe)
  ;
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)&::std::cout);
  uStack_28._0_5_ = CONCAT14(10,(undefined4)uStack_28);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 4),1);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"Buffer Pos: ",0xc);
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)&::std::cout);
  uStack_28._0_6_ = CONCAT15(10,(undefined5)uStack_28);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 5),1);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"End Pos: ",9);
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)&::std::cout);
  uStack_28._0_7_ = CONCAT16(10,(undefined6)uStack_28);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 6),1);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"------------",0xc);
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)&::std::cout);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  return;
}

Assistant:

void CSVBoundary::Print() const {
#ifndef DUCKDB_DISABLE_PRINT
	std::cout << "---Boundary: " << boundary_idx << " ---" << '\n';
	std::cout << "Buffer Index: " << buffer_idx << '\n';
	std::cout << "Buffer Pos: " << buffer_pos << '\n';
	std::cout << "End Pos: " << end_pos << '\n';
	std::cout << "------------" << end_pos << '\n';
#endif
}